

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O0

int secp256k1_scratch_allocate_frame(secp256k1_scratch *scratch,size_t n,size_t objects)

{
  size_t sVar1;
  void *pvVar2;
  secp256k1_callback *in_RDX;
  ulong in_RSI;
  secp256k1_scratch *in_RDI;
  ulong size;
  int local_4;
  
  size = in_RSI;
  sVar1 = secp256k1_scratch_max_allocation(in_RDI,(size_t)in_RDX);
  if (sVar1 < size) {
    local_4 = 0;
  }
  else {
    pvVar2 = checked_malloc(in_RDX,size);
    in_RDI->data[in_RDI->frame] = pvVar2;
    if (in_RDI->data[in_RDI->frame] == (void *)0x0) {
      local_4 = 0;
    }
    else {
      in_RDI->frame_size[in_RDI->frame] = (long)in_RDX * 0x10 + in_RSI;
      in_RDI->offset[in_RDI->frame] = 0;
      in_RDI->frame = in_RDI->frame + 1;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int secp256k1_scratch_allocate_frame(secp256k1_scratch* scratch, size_t n, size_t objects) {
    VERIFY_CHECK(scratch->frame < SECP256K1_SCRATCH_MAX_FRAMES);

    if (n <= secp256k1_scratch_max_allocation(scratch, objects)) {
        n += objects * ALIGNMENT;
        scratch->data[scratch->frame] = checked_malloc(scratch->error_callback, n);
        if (scratch->data[scratch->frame] == NULL) {
            return 0;
        }
        scratch->frame_size[scratch->frame] = n;
        scratch->offset[scratch->frame] = 0;
        scratch->frame++;
        return 1;
    } else {
        return 0;
    }
}